

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
MultiState<true>::StartObject(MultiState<true> *this,Context<true> *ctx)

{
  example **ppeVar1;
  v_array<example_*> *in_RSI;
  example **in_RDI;
  BaseState<true> *in_stack_00000070;
  char *in_stack_00000078;
  Context<true> *in_stack_00000080;
  
  ppeVar1 = (example **)(*(code *)in_RSI[3]._end)(in_RSI[3].end_array);
  in_RSI[2].end_array = ppeVar1;
  (*(code *)(in_RSI->_end[1]->super_example_predict).feature_space[7].indicies.erase_count)
            (in_RSI[2].end_array + 0xd05);
  v_array<example_*>::push_back(in_RSI,in_RDI);
  Context<true>::PushNamespace(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  return (BaseState<true> *)&in_RSI[3].erase_count;
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    // allocate new example
    ctx.ex = &(*ctx.example_factory)(ctx.example_factory_context);
    ctx.all->p->lp.default_label(&ctx.ex->l);
    ctx.examples->push_back(ctx.ex);

    // setup default namespace
    ctx.PushNamespace(" ", this);

    return &ctx.default_state;
  }